

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6ValidSelfIssuedpathLenConstraintTest17<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section6ValidSelfIssuedpathLenConstraintTest17
          (Section6ValidSelfIssuedpathLenConstraintTest17<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6ValidSelfIssuedpathLenConstraintTest17) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "pathLenConstraint1CACert",
                               "pathLenConstraint1SelfIssuedCACert",
                               "pathLenConstraint1subCACert",
                               "pathLenConstraint1SelfIssuedsubCACert",
                               "ValidSelfIssuedpathLenConstraintTest17EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint1CACRL",
                              "pathLenConstraint1subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.17";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}